

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

void __thiscall ON_OBSOLETE_V5_DimExtra::SetDefaults(ON_OBSOLETE_V5_DimExtra *this)

{
  double dVar1;
  
  (this->m_partent_uuid).Data1 = 0;
  (this->m_partent_uuid).Data2 = 0;
  (this->m_partent_uuid).Data3 = 0;
  (this->m_partent_uuid).Data4[0] = '\0';
  (this->m_partent_uuid).Data4[1] = '\0';
  (this->m_partent_uuid).Data4[2] = '\0';
  (this->m_partent_uuid).Data4[3] = '\0';
  (this->m_partent_uuid).Data4[4] = '\0';
  (this->m_partent_uuid).Data4[5] = '\0';
  (this->m_partent_uuid).Data4[6] = '\0';
  (this->m_partent_uuid).Data4[7] = '\0';
  this->m_arrow_position = 0;
  this->m_text_rects = (ON_OBSOLETE_V5_RECT *)0x0;
  this->m_distance_scale = 1.0;
  dVar1 = ON_3dPoint::Origin.y;
  (this->m_modelspace_basepoint).x = ON_3dPoint::Origin.x;
  (this->m_modelspace_basepoint).y = dVar1;
  (this->m_modelspace_basepoint).z = ON_3dPoint::Origin.z;
  (this->m_detail_measured).Data1 = 0;
  (this->m_detail_measured).Data2 = 0;
  (this->m_detail_measured).Data3 = 0;
  (this->m_detail_measured).Data4[0] = '\0';
  (this->m_detail_measured).Data4[1] = '\0';
  (this->m_detail_measured).Data4[2] = '\0';
  (this->m_detail_measured).Data4[3] = '\0';
  (this->m_detail_measured).Data4[4] = '\0';
  (this->m_detail_measured).Data4[5] = '\0';
  (this->m_detail_measured).Data4[6] = '\0';
  (this->m_detail_measured).Data4[7] = '\0';
  return;
}

Assistant:

void ON_OBSOLETE_V5_DimExtra::SetDefaults()
{
  m_partent_uuid = ON_nil_uuid;
  
  m_arrow_position = 0;
  m_text_rects = 0;
  m_distance_scale = 1.0;
  m_modelspace_basepoint = ON_3dPoint::Origin;
  m_detail_measured = ON_nil_uuid;
}